

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColorPicker.cpp
# Opt level: O1

void __thiscall gui::ColorPicker::draw(ColorPicker *this)

{
  RenderTarget *in_RSI;
  undefined1 in_stack_00000008 [104];
  
  draw((ColorPicker *)
       &this[-1].hsvaTextBoxes_._M_elems[3].
        super___shared_ptr<gui::MultilineTextBox,_(__gnu_cxx::_Lock_policy)2>._M_refcount,in_RSI,
       (RenderStates)in_stack_00000008);
  return;
}

Assistant:

void ColorPicker::draw(sf::RenderTarget& target, sf::RenderStates states) const {
    if (!isVisible()) {
        return;
    }
    states.transform *= getTransform();

    target.draw(shadingRectangle_, states);
    const sf::Vector2f shadingRectangleSize = getShadingRectangleSize();
    style_->dot_.setPosition(currentColorHsva_[1] * shadingRectangleSize.x, (1.0f - currentColorHsva_[2]) * shadingRectangleSize.y);
    style_->dot_.setFillColor({roundedColorRgba_.r, roundedColorRgba_.g, roundedColorRgba_.b, 255});
    target.draw(style_->dot_, states);

    target.draw(hueBar_, states);
    states.texture = &alphaTexture_;
    target.draw(alphaBar_, states);
    states.texture = nullptr;

    for (const auto& child : getChildren()) {
        target.draw(*child, states);
    }
}